

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWPointerArray.h
# Opt level: O1

void __thiscall
COLLADAFW::PointerArray<COLLADAFW::Transformation>::cloneContents
          (PointerArray<COLLADAFW::Transformation> *this,
          PointerArray<COLLADAFW::Transformation> *pre)

{
  size_t minCapacity;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  
  minCapacity = (pre->super_ArrayPrimitiveType<COLLADAFW::Transformation_*>).mCount;
  ArrayPrimitiveType<COLLADAFW::Transformation_*>::reallocMemory
            (&this->super_ArrayPrimitiveType<COLLADAFW::Transformation_*>,minCapacity);
  if (minCapacity != 0) {
    sVar2 = 0;
    do {
      iVar1 = (*((pre->super_ArrayPrimitiveType<COLLADAFW::Transformation_*>).mData[sVar2]->
                super_Animatable)._vptr_Animatable[2])();
      (this->super_ArrayPrimitiveType<COLLADAFW::Transformation_*>).mData[sVar2] =
           (Transformation *)CONCAT44(extraout_var,iVar1);
      sVar2 = sVar2 + 1;
    } while (minCapacity != sVar2);
  }
  (this->super_ArrayPrimitiveType<COLLADAFW::Transformation_*>).mCount = minCapacity;
  return;
}

Assistant:

void cloneContents(const PointerArray& pre)
		{
			size_t newCount = pre.getCount();
			ArrayPrimitiveType<T*>::reallocMemory(newCount);
			for ( size_t i = 0; i < newCount; ++i)
			{
				(*this)[i] = pre[i]->clone();
			}
			ArrayPrimitiveType<T*>::mCount = newCount;
		}